

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O3

DataStream * __thiscall DataStream::operator>>(DataStream *this,BlockTransactions *obj)

{
  size_t in_RCX;
  long in_FS_OFFSET;
  ParamsStream<DataStream_&,_TransactionSerParams> local_30;
  VectorFormatter<DefaultFormatter> local_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  read(this,(int)obj,(void *)0x20,in_RCX);
  local_30.m_params = &::TX_WITH_WITNESS;
  local_30.m_substream = this;
  VectorFormatter<DefaultFormatter>::
  Unser<ParamsStream<DataStream&,TransactionSerParams>,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>
            (&local_19,&local_30,&obj->txn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

DataStream& operator>>(T&& obj)
    {
        ::Unserialize(*this, obj);
        return (*this);
    }